

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> * __thiscall
helics::apps::Connector::buildPossibleConnectionList
          (vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
           *__return_storage_ptr__,Connector *this,string_view startingInterface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList)

{
  unsigned_long *puVar1;
  pointer puVar2;
  size_t sVar3;
  pointer pCVar4;
  pointer psVar5;
  element_type *peVar6;
  char *pcVar7;
  string_view testString;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar8;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  _Var9;
  pointer pCVar10;
  iterator iVar11;
  type match_1;
  pointer psVar12;
  pointer puVar13;
  Connection *__p;
  unsigned_long *puVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  unsigned_long *puVar18;
  unsigned_long *puVar19;
  unsigned_long *puVar20;
  ulong uVar21;
  type match;
  bool bVar22;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
  pVar23;
  string mstring;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  searched;
  undefined1 local_e1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  string local_c8;
  key_type local_a8;
  undefined1 local_98 [16];
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  _Base_ptr local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  element_type *peStack_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Connector *local_40;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_38;
  
  local_a8._M_str = startingInterface._M_str;
  local_a8._M_len = startingInterface._M_len;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &(this->connections)._M_h;
  local_e0 = tagList;
  pVar23 = CLI::std::
           _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::equal_range(local_38,&local_a8);
  _Var9._M_cur = (__node_type *)
                 pVar23.first.
                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                 ._M_cur;
  if (_Var9._M_cur != (__node_type *)0x0) {
    p_Stack_80 = (_Base_ptr)(local_98 + 8);
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    local_88 = (_Base_ptr)0x0;
    local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78 = p_Stack_80;
    std::
    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>const&>
              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)local_98,&local_a8);
    local_40 = this;
    for (; (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
            )_Var9._M_cur !=
           pVar23.second.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
           ._M_cur.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
        ; _Var9._M_cur = (__node_type *)((_Var9._M_cur)->super__Hash_node_base)._M_nxt) {
      puVar14 = *(unsigned_long **)
                 ((long)&((_Var9._M_cur)->
                         super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                         ._M_storage._M_storage + 0x38);
      puVar1 = *(unsigned_long **)
                ((long)&((_Var9._M_cur)->
                        super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                        ._M_storage._M_storage + 0x40);
      if (puVar14 == puVar1) {
LAB_0029f8ae:
        std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
        emplace_back<helics::apps::Connection_const&>
                  ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>> *)
                   __return_storage_ptr__,
                   (Connection *)
                   ((long)&((_Var9._M_cur)->
                           super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                           ._M_storage._M_storage + 0x10));
        pCVar10 = (__return_storage_ptr__->
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        sVar3 = pCVar10[-1].interface1._M_len;
        if ((sVar3 != local_a8._M_len) ||
           ((sVar3 != 0 &&
            (iVar8 = bcmp(pCVar10[-1].interface1._M_str,local_a8._M_str,sVar3), iVar8 != 0)))) {
          local_c8._M_dataplus._M_p = (pointer)pCVar10[-1].interface1._M_len;
          local_c8._M_string_length = (size_type)pCVar10[-1].interface1._M_str;
          pcVar7 = pCVar10[-1].interface2._M_str;
          pCVar10[-1].interface1._M_len = pCVar10[-1].interface2._M_len;
          pCVar10[-1].interface1._M_str = pcVar7;
          pCVar10[-1].interface2._M_len = (size_t)local_c8._M_dataplus._M_p;
          pCVar10[-1].interface2._M_str = (char *)local_c8._M_string_length;
        }
      }
      else {
        puVar13 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar17 = puVar2;
        if (puVar13 != puVar2) {
          puVar15 = puVar2;
          do {
            puVar20 = puVar14;
            if (*puVar13 == *puVar14) {
              bVar22 = false;
              puVar16 = puVar13;
            }
            else {
              do {
                puVar20 = puVar20 + 1;
                bVar22 = puVar20 == puVar1;
                puVar16 = puVar15;
                if (bVar22) break;
                puVar16 = puVar13;
              } while (*puVar13 != *puVar20);
            }
            puVar17 = puVar16;
          } while ((bVar22) &&
                  (puVar13 = puVar13 + 1, puVar17 = puVar2, puVar15 = puVar16, puVar13 != puVar2));
        }
        if (puVar17 != puVar2) goto LAB_0029f8ae;
      }
    }
    pCVar10 = (__return_storage_ptr__->
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
        _M_impl.super__Vector_impl_data._M_finish != pCVar10) {
      uVar21 = 0;
      do {
        iVar11 = CLI::std::
                 _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_98,&pCVar10[uVar21].interface2);
        if (iVar11._M_node == (_Base_ptr)(local_98 + 8)) {
          std::
          _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_insert_unique<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)local_98,
                     &(__return_storage_ptr__->
                      super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar21].interface2);
          pVar23 = CLI::std::
                   _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   ::equal_range(local_38,&(__return_storage_ptr__->
                                           super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar21].
                                           interface2);
          _Var9._M_cur = (__node_type *)
                         pVar23.first.
                         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                         ._M_cur;
          if ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
               )_Var9._M_cur !=
              pVar23.second.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
              && _Var9._M_cur != (__node_type *)0x0) {
            do {
              puVar14 = *(unsigned_long **)
                         ((long)&((_Var9._M_cur)->
                                 super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                 ._M_storage._M_storage + 0x38);
              puVar1 = *(unsigned_long **)
                        ((long)&((_Var9._M_cur)->
                                super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                ._M_storage._M_storage + 0x40);
              if (puVar14 == puVar1) {
LAB_0029f9f4:
                std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
                emplace_back<helics::apps::Connection_const&>
                          ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>
                            *)__return_storage_ptr__,
                           (Connection *)
                           ((long)&((_Var9._M_cur)->
                                   super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>
                                   ._M_storage._M_storage + 0x10));
                pCVar10 = (__return_storage_ptr__->
                          super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pCVar4 = (__return_storage_ptr__->
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                sVar3 = pCVar4[-1].interface1._M_len;
                if ((sVar3 != pCVar10[uVar21].interface2._M_len) ||
                   ((sVar3 != 0 &&
                    (iVar8 = bcmp(pCVar4[-1].interface1._M_str,pCVar10[uVar21].interface2._M_str,
                                  sVar3), iVar8 != 0)))) {
                  local_c8._M_dataplus._M_p = (pointer)pCVar4[-1].interface1._M_len;
                  local_c8._M_string_length = (size_type)pCVar4[-1].interface1._M_str;
                  pcVar7 = pCVar4[-1].interface2._M_str;
                  pCVar4[-1].interface1._M_len = pCVar4[-1].interface2._M_len;
                  pCVar4[-1].interface1._M_str = pcVar7;
                  pCVar4[-1].interface2._M_len = (size_t)local_c8._M_dataplus._M_p;
                  pCVar4[-1].interface2._M_str = (char *)local_c8._M_string_length;
                }
                iVar11 = CLI::std::
                         _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)local_98,
                                &(__return_storage_ptr__->
                                 super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                 )._M_impl.super__Vector_impl_data._M_finish[-1].interface2);
                if (iVar11._M_node != (_Base_ptr)(local_98 + 8)) {
                  __p = (__return_storage_ptr__->
                        super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1;
                  (__return_storage_ptr__->
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  )._M_impl.super__Vector_impl_data._M_finish = __p;
                  CLI::std::allocator_traits<std::allocator<helics::apps::Connection>_>::
                  destroy<helics::apps::Connection>((allocator_type *)__return_storage_ptr__,__p);
                }
              }
              else {
                puVar13 = (local_e0->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                puVar2 = (local_e0->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                puVar17 = puVar2;
                if (puVar13 != puVar2) {
                  puVar15 = puVar2;
                  do {
                    puVar20 = puVar14;
                    if (*puVar13 == *puVar14) {
                      bVar22 = false;
                      puVar16 = puVar13;
                    }
                    else {
                      do {
                        puVar20 = puVar20 + 1;
                        bVar22 = puVar20 == puVar1;
                        puVar16 = puVar15;
                        if (bVar22) break;
                        puVar16 = puVar13;
                      } while (*puVar13 != *puVar20);
                    }
                    puVar17 = puVar16;
                  } while ((bVar22) &&
                          (puVar13 = puVar13 + 1, puVar17 = puVar2, puVar15 = puVar16,
                          puVar13 != puVar2));
                }
                if (puVar17 != puVar2) goto LAB_0029f9f4;
              }
              _Var9._M_cur = (__node_type *)((_Var9._M_cur)->super__Hash_node_base)._M_nxt;
            } while ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                      )_Var9._M_cur !=
                     pVar23.second.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                    );
          }
        }
        uVar21 = uVar21 + 1;
        pCVar10 = (__return_storage_ptr__->
                  super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar21 < (ulong)(((long)(__return_storage_ptr__->
                                       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar10
                                >> 4) * -0x3333333333333333));
    }
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_98);
    this = local_40;
  }
  if (((__return_storage_ptr__->
       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
       _M_impl.super__Vector_impl_data._M_start ==
       (__return_storage_ptr__->
       super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>).
       _M_impl.super__Vector_impl_data._M_finish) || (this->alwaysCheckRegex == true)) {
    psVar12 = (this->regexMatchers).
              super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->regexMatchers).
             super__Vector_base<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar12 != psVar5) {
      do {
        peVar6 = (psVar12->
                 super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        puVar13 = (peVar6->tags).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (peVar6->tags).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar13 == puVar2) {
LAB_0029fb64:
          testString._M_str = local_a8._M_str;
          testString._M_len = local_a8._M_len;
          RegexMatcher::generateMatch_abi_cxx11_
                    (&local_c8,
                     (psVar12->
                     super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,testString);
          if ((char *)local_c8._M_string_length != (char *)0x0) {
            local_88 = (_Base_ptr)0x0;
            p_Stack_80 = (_Base_ptr)0x0;
            local_98._0_8_ = 0;
            local_98._8_8_ = (char *)0x0;
            local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            peStack_58 = (element_type *)0x0;
            local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                      (&_Stack_d0,&local_d8,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_e1,&local_c8);
            this_00._M_pi = local_50._M_pi;
            local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d0._M_pi;
            peStack_58 = local_d8;
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
            }
            if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
            }
            peVar6 = (psVar12->
                     super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_98._0_8_ = (peVar6->interface1)._M_len;
            local_98._8_8_ = (peVar6->interface1)._M_str;
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&local_70,
                       &((psVar12->
                         super___shared_ptr<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr)->tags);
            p_Stack_80 = (_Base_ptr)(peStack_58->_M_dataplus)._M_p;
            local_88 = (_Base_ptr)peStack_58->_M_string_length;
            local_78 = (_Base_ptr)CONCAT44(local_78._4_4_,1);
            CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
            emplace_back<helics::apps::Connection>(__return_storage_ptr__,(Connection *)local_98);
            if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_pi);
            }
            if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_70.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_70.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          puVar14 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar1 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar20 = puVar1;
          if (puVar14 != puVar1) {
            puVar18 = puVar1;
            do {
              puVar17 = puVar13;
              if (*puVar14 == *puVar13) {
                bVar22 = false;
                puVar19 = puVar14;
              }
              else {
                do {
                  puVar17 = puVar17 + 1;
                  bVar22 = puVar17 == puVar2;
                  puVar19 = puVar18;
                  if (bVar22) break;
                  puVar19 = puVar14;
                } while (*puVar14 != *puVar17);
              }
              puVar20 = puVar19;
            } while ((bVar22) &&
                    (puVar14 = puVar14 + 1, puVar20 = puVar1, puVar18 = puVar19, puVar14 != puVar1))
            ;
          }
          if (puVar20 != puVar1) goto LAB_0029fb64;
        }
        psVar12 = psVar12 + 1;
      } while (psVar12 != psVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Connection>
    Connector::buildPossibleConnectionList(std::string_view startingInterface,
                                           const std::vector<std::size_t>& tagList) const
{
    std::vector<Connection> matches;
    auto [first, last] = connections.equal_range(startingInterface);
    if (first != connections.end()) {
        std::set<std::string_view> searched;
        searched.insert(startingInterface);

        for (auto match = first; match != last; ++match) {
            if (match->second.tags.empty() ||
                std::find_first_of(tagList.begin(),
                                   tagList.end(),
                                   match->second.tags.begin(),
                                   match->second.tags.end()) != tagList.end()) {
                matches.emplace_back(match->second);
                if (matches.back().interface1 != startingInterface) {
                    std::swap(matches.back().interface1, matches.back().interface2);
                }
            }
        }
        std::size_t cascadeIndex{0};
        while (cascadeIndex < matches.size()) {
            if (searched.find(matches[cascadeIndex].interface2) != searched.end()) {
                ++cascadeIndex;
                continue;
            }
            searched.insert(matches[cascadeIndex].interface2);
            std::tie(first, last) = connections.equal_range(matches[cascadeIndex].interface2);
            if (first != connections.end()) {
                for (auto match = first; match != last; ++match) {
                    if (match->second.tags.empty() ||
                        std::find_first_of(tagList.begin(),
                                           tagList.end(),
                                           match->second.tags.begin(),
                                           match->second.tags.end()) != tagList.end()) {
                        matches.emplace_back(match->second);
                        if (matches.back().interface1 != matches[cascadeIndex].interface2) {
                            std::swap(matches.back().interface1, matches.back().interface2);
                        }
                        if (searched.find(matches.back().interface2) != searched.end()) {
                            // this would already be references and create a cyclic reference
                            matches.pop_back();
                        }
                    }
                }
            }
            ++cascadeIndex;
        }
    }
    if (matches.empty() || alwaysCheckRegex) {
        if (!regexMatchers.empty()) {
            for (const auto& rmatcher : regexMatchers) {
                if (rmatcher->tags.empty() ||
                    std::find_first_of(tagList.begin(),
                                       tagList.end(),
                                       rmatcher->tags.begin(),
                                       rmatcher->tags.end()) != tagList.end()) {
                    auto mstring = rmatcher->generateMatch(startingInterface);
                    if (!mstring.empty()) {
                        Connection connection;
                        connection.stringBuffer = std::make_shared<std::string>(mstring);
                        connection.interface1 = rmatcher->interface1;
                        connection.tags = rmatcher->tags;
                        connection.interface2 = *connection.stringBuffer;
                        connection.direction = InterfaceDirection::FROM_TO;
                        matches.push_back(std::move(connection));
                    }
                }
            }
        }
    }
    return matches;
}